

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_vec3 rf_unproject(rf_vec3 source,rf_mat proj,rf_mat view)

{
  rf_mat mat;
  float fVar1;
  rf_vec3 rVar2;
  rf_mat mat_viewProj;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  fVar1 = source.z;
  rf_mat_mul(view,proj);
  mat._8_8_ = local_68;
  mat._0_8_ = uStack_70;
  mat._16_8_ = uStack_60;
  mat.m9 = proj.m0;
  mat.m13 = proj.m4;
  mat.m2 = proj.m8;
  mat.m6 = proj.m12;
  mat.m10 = proj.m1;
  mat.m14 = proj.m5;
  mat.m3 = proj.m9;
  mat.m7 = proj.m13;
  mat.m11 = proj.m2;
  mat.m15 = proj.m6;
  rf_mat_invert(mat);
  local_a8 = source.x;
  uStack_a4 = source.y;
  uStack_94 = (float)((ulong)local_50 >> 0x20);
  local_98 = (float)local_50;
  uStack_90 = (float)uStack_48;
  uStack_8c = (float)((ulong)uStack_48 >> 0x20);
  uStack_84 = (float)((ulong)local_40 >> 0x20);
  local_88 = (float)local_40;
  uStack_80 = (float)uStack_38;
  uStack_7c = (float)((ulong)uStack_38 >> 0x20);
  uStack_74 = (float)((ulong)local_30 >> 0x20);
  local_78 = (float)local_30;
  uStack_70._0_4_ = (float)uStack_28;
  uStack_70._4_4_ = (float)((ulong)uStack_28 >> 0x20);
  local_68._4_4_ = (float)((ulong)local_20 >> 0x20);
  local_68._0_4_ = (float)local_20;
  uStack_60._0_4_ = (float)uStack_18;
  uStack_60._4_4_ = (float)((ulong)uStack_18 >> 0x20);
  uStack_60._4_4_ =
       fVar1 * (float)uStack_60 + (float)local_68 * local_a8 + uStack_a4 * local_68._4_4_ +
       uStack_60._4_4_;
  rVar2.x = (uStack_90 * fVar1 + local_98 * local_a8 + uStack_94 * uStack_a4 + uStack_8c) /
            uStack_60._4_4_;
  rVar2.z = ((float)uStack_70 * fVar1 + local_78 * local_a8 + uStack_74 * uStack_a4 +
            uStack_70._4_4_) / uStack_60._4_4_;
  rVar2.y = (uStack_80 * fVar1 + local_88 * local_a8 + uStack_84 * uStack_a4 + uStack_7c) /
            uStack_60._4_4_;
  return rVar2;
}

Assistant:

RF_API rf_vec3 rf_unproject(rf_vec3 source, rf_mat proj, rf_mat view)
{
    rf_vec3 result = {0.0f, 0.0f, 0.0f};

    // Calculate unproject matrix (multiply view patrix by rf_ctx->gl_ctx.projection matrix) and invert it
    rf_mat mat_viewProj = rf_mat_mul(view, proj);
    mat_viewProj = rf_mat_invert(mat_viewProj);

    // Create quaternion from source point
    rf_quaternion quat = {source.x, source.y, source.z, 1.0f};

    // Multiply quat point by unproject matrix
    quat = rf_quaternion_transform(quat, mat_viewProj);

    // Normalized world points in vectors
    result.x = quat.x / quat.w;
    result.y = quat.y / quat.w;
    result.z = quat.z / quat.w;

    return result;
}